

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O1

bool __thiscall cursespp::LayoutBase::SetFocus(LayoutBase *this,IWindowPtr *focus)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  pointer psVar6;
  ulong uVar7;
  bool bVar8;
  __shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> a_Stack_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined1 local_48 [24];
  IMessageTarget local_30;
  
  peVar1 = (focus->super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this->focused = -2;
    EnsureValidFocus((LayoutBase *)(local_48 + 0x10));
    bVar8 = true;
    local_48._8_8_ = local_30._vptr_IMessageTarget;
  }
  else {
    psVar6 = (this->focusable).
             super__Vector_base<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->focusable).
                  super__Vector_base<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6;
    bVar8 = lVar4 != 0;
    if (lVar4 == 0) {
      return bVar8;
    }
    uVar5 = lVar4 >> 4;
    if ((psVar6->super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == peVar1
       ) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        psVar6 = psVar6 + 1;
        if ((uVar5 + (uVar5 == 0)) - 1 == uVar7) {
          return uVar7 + 1 < uVar5;
        }
        uVar7 = uVar7 + 1;
      } while ((psVar6->super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
               peVar1);
      bVar8 = uVar7 < uVar5;
    }
    iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x25])(this);
    if (CONCAT44(extraout_var,iVar2) == 0) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar2),&IWindow::typeinfo,
                                      &ILayout::typeinfo,0xfffffffffffffffe);
    }
    if (plVar3 != (long *)0x0) {
      std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cursespp::IWindow,void>
                (a_Stack_58,
                 (__weak_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_Window).super_enable_shared_from_this<cursespp::IWindow>);
      (**(code **)(*plVar3 + 0x60))(plVar3,a_Stack_58);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
    }
    this->focused = (int)uVar7;
    EnsureValidFocus((LayoutBase *)local_48);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  return bVar8;
}

Assistant:

bool LayoutBase::SetFocus(IWindowPtr focus) {
    if (!focus) {
        this->focused = NO_FOCUS;
        this->EnsureValidFocus();
        return true;
    }
    else {
        for (size_t i = 0; i < this->focusable.size(); i++) {
            if (this->focusable[i] == focus) {
                /* if we're focused, we need to ensure our parent sets its correct
                focus index to us! and so on up to the root view. note that this
                needs to be called before updating our internal focus; recursively,
                parents need to have their focus index set before children */
                auto asLayout = dynamic_cast<ILayout*>(this->GetParent());
                if (asLayout) {
                    asLayout->SetFocus(shared_from_this());
                }
                this->focused = i;
                this->EnsureValidFocus();
                return true;
            }
        }
    }
    return false;
}